

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O1

rtc_WavWriter * rtc_WavOpen(char *filename,int sample_rate,size_t num_channels)

{
  WavWriter *this;
  allocator local_41;
  string local_40;
  
  this = (WavWriter *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_40,filename,&local_41);
  webrtc::WavWriter::WavWriter(this,&local_40,sample_rate,num_channels);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return (rtc_WavWriter *)this;
}

Assistant:

rtc_WavWriter* rtc_WavOpen(const char* filename,
                           int sample_rate,
                           size_t num_channels) {
  return reinterpret_cast<rtc_WavWriter*>(
      new webrtc::WavWriter(filename, sample_rate, num_channels));
}